

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_char> * cimg_library::CImg<unsigned_char>::default_LUT256(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  
  if (default_LUT256()::colormap == '\0') {
    default_LUT256();
  }
  if (cimg::Mutex_attr()::val == '\0') {
    default_LUT256();
  }
  pthread_mutex_lock((pthread_mutex_t *)(cimg::Mutex_attr()::val + 0x140));
  if (default_LUT256::colormap._data == (uchar *)0x0) {
    assign(&default_LUT256::colormap,1,0x100,1,3);
    uVar2 = 0;
    uVar1 = 0x10;
    do {
      uVar4 = uVar2;
      uVar3 = 0x10;
      do {
        uVar2 = uVar4 + 4;
        iVar6 = -0x100;
        do {
          uVar5 = (ulong)uVar4;
          default_LUT256::colormap._data[default_LUT256::colormap._width * uVar5] = (uchar)uVar1;
          default_LUT256::colormap._data
          [(ulong)default_LUT256::colormap._height * (ulong)default_LUT256::colormap._width +
           default_LUT256::colormap._width * uVar5] = (uchar)uVar3;
          uVar4 = uVar4 + 1;
          default_LUT256::colormap._data
          [(ulong)default_LUT256::colormap._height * (ulong)default_LUT256::colormap._width * 2 +
           uVar5 * default_LUT256::colormap._width] = (char)iVar6 + ' ';
          iVar6 = iVar6 + 0x40;
        } while (iVar6 != 0);
        bVar7 = uVar3 < 0xe0;
        uVar4 = uVar2;
        uVar3 = uVar3 + 0x20;
      } while (bVar7);
      bVar7 = uVar1 < 0xe0;
      uVar1 = uVar1 + 0x20;
    } while (bVar7);
  }
  if (cimg::Mutex_attr()::val == '\0') {
    default_LUT256();
  }
  pthread_mutex_unlock((pthread_mutex_t *)(cimg::Mutex_attr()::val + 0x140));
  return &default_LUT256::colormap;
}

Assistant:

static const CImg<Tuchar>& default_LUT256() {
      static CImg<Tuchar> colormap;
      cimg::mutex(8);
      if (!colormap) {
        colormap.assign(1,256,1,3);
        for (unsigned int index = 0, r = 16; r<256; r+=32)
          for (unsigned int g = 16; g<256; g+=32)
            for (unsigned int b = 32; b<256; b+=64) {
              colormap(0,index,0) = (Tuchar)r;
              colormap(0,index,1) = (Tuchar)g;
              colormap(0,index++,2) = (Tuchar)b;
            }
      }
      cimg::mutex(8,0);
      return colormap;
    }